

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WindowCodeInit(Parse *pParse,Window *pMWin)

{
  Window **ppWVar1;
  char *pcVar2;
  Op *pOVar3;
  Vdbe *p;
  KeyInfo *p4;
  int iVar4;
  Window *pWVar5;
  int iVar6;
  
  p = sqlite3GetVdbe(pParse);
  if (pMWin->pPartition != (ExprList *)0x0) {
    iVar4 = pParse->nMem + 1;
    iVar6 = pParse->nMem + pMWin->pPartition->nExpr;
    pMWin->regPart = iVar4;
    pParse->nMem = iVar6;
    sqlite3VdbeAddOp3(p,0x49,0,iVar4,iVar6);
  }
  iVar4 = pParse->nMem + 1;
  pParse->nMem = iVar4;
  pMWin->regOne = iVar4;
  sqlite3VdbeAddOp3(p,0x46,1,iVar4,0);
  if (pMWin->eExclude != '\0') {
    iVar6 = pParse->nMem;
    iVar4 = iVar6 + 1;
    pParse->nMem = iVar4;
    pMWin->regStartRowid = iVar4;
    iVar6 = iVar6 + 2;
    pParse->nMem = iVar6;
    pMWin->regEndRowid = iVar6;
    iVar6 = pParse->nTab;
    pParse->nTab = iVar6 + 1;
    pMWin->csrApp = iVar6;
    sqlite3VdbeAddOp3(p,0x46,1,iVar4,0);
    sqlite3VdbeAddOp3(p,0x46,0,pMWin->regEndRowid,0);
    sqlite3VdbeAddOp3(p,0x6f,pMWin->csrApp,pMWin->iEphCsr,0);
    return;
  }
  pWVar5 = pMWin;
  if (pMWin != (Window *)0x0) {
    do {
      if (((pWVar5->pFunc->funcFlags & 0x1000) == 0) || (pWVar5->eStart == 'W')) {
        pcVar2 = pWVar5->pFunc->zName;
        if (pcVar2 == "nth_value" || pcVar2 == "first_value") {
          iVar6 = pParse->nMem;
          pWVar5->regApp = iVar6 + 1;
          iVar4 = pParse->nTab;
          pParse->nTab = iVar4 + 1;
          pWVar5->csrApp = iVar4;
          pParse->nMem = iVar6 + 2;
        }
        else {
          if (pcVar2 != "lead" && pcVar2 != "lag") goto LAB_001809f4;
          iVar4 = pParse->nTab;
          pParse->nTab = iVar4 + 1;
          pWVar5->csrApp = iVar4;
        }
        sqlite3VdbeAddOp3(p,0x6f,iVar4,pMWin->iEphCsr,0);
      }
      else {
        p4 = sqlite3KeyInfoFromExprList(pParse,(pWVar5->pOwner->x).pList,0,0);
        iVar4 = pParse->nTab;
        pParse->nTab = iVar4 + 1;
        pWVar5->csrApp = iVar4;
        iVar4 = pParse->nMem;
        pWVar5->regApp = iVar4 + 1;
        pParse->nMem = iVar4 + 3;
        if ((p4 != (KeyInfo *)0x0) && (pWVar5->pFunc->zName[1] == 'i')) {
          *p4->aSortOrder = '\x01';
        }
        sqlite3VdbeAddOp3(p,0x71,pWVar5->csrApp,2,0);
        if (p->db->mallocFailed == '\0') {
          pOVar3 = p->aOp;
          iVar4 = p->nOp;
          pOVar3[(long)iVar4 + -1].p4type = -9;
          pOVar3[(long)iVar4 + -1].p4.pKeyInfo = p4;
        }
        else {
          freeP4(p->db,-9,p4);
        }
        sqlite3VdbeAddOp3(p,0x46,0,pWVar5->regApp + 1,0);
      }
LAB_001809f4:
      ppWVar1 = &pWVar5->pNextWin;
      pWVar5 = *ppWVar1;
    } while (*ppWVar1 != (Window *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeInit(Parse *pParse, Window *pMWin){
  Window *pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);

  /* Allocate registers to use for PARTITION BY values, if any. Initialize
  ** said registers to NULL.  */
  if( pMWin->pPartition ){
    int nExpr = pMWin->pPartition->nExpr;
    pMWin->regPart = pParse->nMem+1;
    pParse->nMem += nExpr;
    sqlite3VdbeAddOp3(v, OP_Null, 0, pMWin->regPart, pMWin->regPart+nExpr-1);
  }

  pMWin->regOne = ++pParse->nMem;
  sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regOne);

  if( pMWin->eExclude ){
    pMWin->regStartRowid = ++pParse->nMem;
    pMWin->regEndRowid = ++pParse->nMem;
    pMWin->csrApp = pParse->nTab++;
    sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->csrApp, pMWin->iEphCsr);
    return;
  }

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *p = pWin->pFunc;
    if( (p->funcFlags & SQLITE_FUNC_MINMAX) && pWin->eStart!=TK_UNBOUNDED ){
      /* The inline versions of min() and max() require a single ephemeral
      ** table and 3 registers. The registers are used as follows:
      **
      **   regApp+0: slot to copy min()/max() argument to for MakeRecord
      **   regApp+1: integer value used to ensure keys are unique
      **   regApp+2: output of MakeRecord
      */
      ExprList *pList = pWin->pOwner->x.pList;
      KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pList, 0, 0);
      pWin->csrApp = pParse->nTab++;
      pWin->regApp = pParse->nMem+1;
      pParse->nMem += 3;
      if( pKeyInfo && pWin->pFunc->zName[1]=='i' ){
        assert( pKeyInfo->aSortOrder[0]==0 );
        pKeyInfo->aSortOrder[0] = 1;
      }
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pWin->csrApp, 2);
      sqlite3VdbeAppendP4(v, pKeyInfo, P4_KEYINFO);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp+1);
    }
    else if( p->zName==nth_valueName || p->zName==first_valueName ){
      /* Allocate two registers at pWin->regApp. These will be used to
      ** store the start and end index of the current frame.  */
      pWin->regApp = pParse->nMem+1;
      pWin->csrApp = pParse->nTab++;
      pParse->nMem += 2;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
    else if( p->zName==leadName || p->zName==lagName ){
      pWin->csrApp = pParse->nTab++;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
  }
}